

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbmphandler.cpp
# Opt level: O2

bool QBmpHandler::canRead(QIODevice *device)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  bool bVar3;
  char head [2];
  undefined2 uStack_2e;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (device == (QIODevice *)0x0) {
    _head = 2;
    bVar3 = false;
    QMessageLogger::warning(head,"QBmpHandler::canRead() called with 0 pointer");
  }
  else {
    _head = CONCAT22(uStack_2e,0xaaaa);
    lVar2 = QIODevice::peek((char *)device,(longlong)head);
    if (lVar2 == 2) {
      bVar3 = head == (char  [2])0x4d42;
    }
    else {
      bVar3 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QBmpHandler::canRead(QIODevice *device)
{
    if (!device) {
        qWarning("QBmpHandler::canRead() called with 0 pointer");
        return false;
    }

    char head[2];
    if (device->peek(head, sizeof(head)) != sizeof(head))
        return false;

    return (qstrncmp(head, "BM", 2) == 0);
}